

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

value * __thiscall
mjs::interpreter::impl::do_binary_op
          (value *__return_storage_ptr__,impl *this,token_type op,value *l,value *r)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  wostream *pwVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  string rs;
  wostringstream _woss;
  gc_heap_ptr_untyped local_1d8 [2];
  wstring_view local_1b8;
  value local_1a8 [9];
  
  if (op < minus) {
    if ((0xc0006000UL >> ((ulong)op & 0x3f) & 1) != 0) {
      to_primitive(local_1a8,l,number);
      value::operator=(l,local_1a8);
      value::destroy(local_1a8);
      to_primitive(local_1a8,r,number);
      value::operator=(r,local_1a8);
      value::destroy(local_1a8);
      if ((l->type_ == string) && (r->type_ == string)) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
        pwVar8 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
        mjs::operator<<(pwVar8,op);
        std::__cxx11::wstringbuf::str();
        local_1b8._M_len = local_1d8[0]._8_8_;
        local_1b8._M_str = (wchar_t *)local_1d8[0].heap_;
        throw_runtime_error(&local_1b8,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                            ,0x2ce);
      }
      dVar10 = to_number(l);
      dVar11 = to_number(r);
      if ((int)op < 0x1e) {
        dVar12 = dVar11;
        if ((op == ltequal) || (dVar12 = dVar10, dVar10 = dVar11, op == gtequal)) {
          iVar2 = tri_compare(dVar12,dVar10);
          __return_storage_ptr__->type_ = boolean;
          (__return_storage_ptr__->field_1).b_ = (iVar2 + 1U & 0xfffffffd) != 0;
          return __return_storage_ptr__;
        }
      }
      else {
        dVar12 = dVar11;
        if ((op == gt) || (dVar12 = dVar10, dVar10 = dVar11, op == lt)) {
          iVar2 = tri_compare(dVar12,dVar10);
          __return_storage_ptr__->type_ = boolean;
          (__return_storage_ptr__->field_1).b_ = iVar2 - 1U < 0xfffffffe;
          return __return_storage_ptr__;
        }
      }
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
      pwVar8 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
      mjs::operator<<(pwVar8,op);
      std::__cxx11::wstringbuf::str();
      local_1b8._M_len = local_1d8[0]._8_8_;
      local_1b8._M_str = (wchar_t *)local_1d8[0].heap_;
      throw_runtime_error(&local_1b8,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                          ,0x2e0);
    }
    if ((ulong)op != 0x26) goto LAB_0012952f;
    to_primitive(local_1a8,l,undefined);
    value::operator=(l,local_1a8);
    value::destroy(local_1a8);
    to_primitive(local_1a8,r,undefined);
    value::operator=(r,local_1a8);
    value::destroy(local_1a8);
    if ((l->type_ == string) || (r->type_ == string)) {
      to_string((mjs *)local_1a8,this->heap_,l);
      to_string((mjs *)local_1d8,this->heap_,r);
      operator+((mjs *)&local_1b8,(string *)local_1a8,(string *)local_1d8);
      __return_storage_ptr__->type_ = string;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_1b8._M_len;
      *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1b8._M_str._0_4_;
      if ((gc_heap *)local_1b8._M_len != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_1b8._M_len,
                        (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1b8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(local_1d8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a8);
      return __return_storage_ptr__;
    }
  }
  else {
LAB_0012952f:
    if (op - equalequal < 2) {
      bVar9 = op != equalequal;
      bVar1 = compare_equal(l,r);
LAB_001295af:
      __return_storage_ptr__->type_ = boolean;
      (__return_storage_ptr__->field_1).field5[0] = bVar1 ^ bVar9;
      return __return_storage_ptr__;
    }
    if (op - equalequalequal < 2) {
      bVar9 = op != equalequalequal;
      bVar1 = compare_strict_equal(l,r);
      goto LAB_001295af;
    }
  }
  dVar11 = to_number(l);
  dVar10 = to_number(r);
  if ((int)op < 0x26) {
    if (op == rshiftshift) {
      uVar4 = to_uint32(dVar11);
      uVar5 = to_uint32(dVar10);
      dVar11 = (double)(uVar4 >> ((byte)uVar5 & 0x1f));
    }
    else {
      if (op == lshift) {
        iVar3 = to_int32(dVar11);
        uVar4 = to_uint32(dVar10);
        iVar2 = iVar3 << ((byte)uVar4 & 0x1f);
      }
      else {
        if (op != rshift) goto switchD_001295fa_default;
        iVar3 = to_int32(dVar11);
        uVar4 = to_uint32(dVar10);
        iVar2 = iVar3 >> ((byte)uVar4 & 0x1f);
      }
      dVar11 = (double)iVar2;
    }
    goto LAB_00129730;
  }
  switch(op) {
  case plus:
    dVar11 = dVar11 + dVar10;
    break;
  case minus:
    dVar11 = dVar11 - dVar10;
    break;
  case multiply:
    dVar11 = dVar11 * dVar10;
    break;
  case divide:
    dVar11 = dVar11 / dVar10;
    break;
  case and_:
    uVar6 = to_int32(dVar11);
    uVar7 = to_int32(dVar10);
    uVar7 = uVar7 & uVar6;
    goto LAB_00129729;
  case or_:
    uVar6 = to_int32(dVar11);
    uVar7 = to_int32(dVar10);
    uVar7 = uVar7 | uVar6;
    goto LAB_00129729;
  case xor_:
    uVar6 = to_int32(dVar11);
    uVar7 = to_int32(dVar10);
    uVar7 = uVar7 ^ uVar6;
LAB_00129729:
    dVar11 = (double)(int)uVar7;
    break;
  case mod:
    dVar11 = fmod(dVar11,dVar10);
    break;
  default:
switchD_001295fa_default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
    pwVar8 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
    mjs::operator<<(pwVar8,op);
    std::__cxx11::wstringbuf::str();
    local_1b8._M_len = local_1d8[0]._8_8_;
    local_1b8._M_str = (wchar_t *)local_1d8[0].heap_;
    throw_runtime_error(&local_1b8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                        ,0x2f8);
  }
LAB_00129730:
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = dVar11;
  return __return_storage_ptr__;
}

Assistant:

value do_binary_op(const token_type op, value& l, value& r) {
        if (op == token_type::plus) {
            l = to_primitive(l);
            r = to_primitive(r);
            if (l.type() == value_type::string || r.type() == value_type::string) {
                auto ls = to_string(heap_, l);
                auto rs = to_string(heap_, r);
                return value{ls + rs};
            }
            // Otherwise handle like the other operators
        } else if (is_relational(op)) {
            l = to_primitive(l, value_type::number);
            r = to_primitive(r, value_type::number);
            if (l.type() == value_type::string && r.type() == value_type::string) {
                // TODO: See §11.8.5 step 16-21
                NOT_IMPLEMENTED(op);
            }
            const auto ln = to_number(l);
            const auto rn = to_number(r);
            int res;
            switch (op) {
            case token_type::lt:
                res = tri_compare(ln, rn);
                return value{res == -1 ? false : static_cast<bool>(res)};
            case token_type::ltequal:
                res = tri_compare(rn, ln);
                return value{res == -1 || res == 1 ? false : true};
            case token_type::gt:
                res = tri_compare(rn, ln);
                return value{res == -1 ? false : static_cast<bool>(res)};
            case token_type::gtequal:
                res = tri_compare(ln, rn);
                return value{res == -1 || res == 1 ? false : true};
            default: NOT_IMPLEMENTED(op);
            }
        } else if (op == token_type::equalequal || op == token_type::notequal) {
            const bool eq = compare_equal(l ,r);
            return value{op == token_type::equalequal ? eq : !eq};
        } else if (op == token_type::equalequalequal || op == token_type::notequalequal) {
            const bool eq = compare_strict_equal(l ,r);
            return value{op == token_type::equalequalequal ? eq : !eq};
        }

        const auto ln = to_number(l);
        const auto rn = to_number(r);
        switch (op) {
        case token_type::plus:         return value{ln + rn};
        case token_type::minus:        return value{ln - rn};
        case token_type::multiply:     return value{ln * rn};
        case token_type::divide:       return value{ln / rn};
        case token_type::mod:          return value{std::fmod(ln, rn)};
        case token_type::lshift:       return value{static_cast<double>(to_int32(ln) << (to_uint32(rn) & 0x1f))};
        case token_type::rshift:       return value{static_cast<double>(to_int32(ln) >> (to_uint32(rn) & 0x1f))};
        case token_type::rshiftshift:  return value{static_cast<double>(to_uint32(ln) >> (to_uint32(rn) & 0x1f))};
        case token_type::and_:         return value{static_cast<double>(to_int32(ln) & to_int32(rn))};
        case token_type::xor_:         return value{static_cast<double>(to_int32(ln) ^ to_int32(rn))};
        case token_type::or_:          return value{static_cast<double>(to_int32(ln) | to_int32(rn))};
        default: NOT_IMPLEMENTED(op);
        }
    }